

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

logical pnga_create_ghosts_irreg_config
                  (Integer type,Integer ndim,Integer *dims,Integer *width,char *array_name,
                  Integer *map,Integer *nblock,Integer p_handle,Integer *g_a)

{
  Integer g_a_00;
  logical lVar1;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  pnga_pgroup_sync(p_handle);
  g_a_00 = pnga_create_handle();
  *g_a = g_a_00;
  pnga_set_data(g_a_00,ndim,dims,type);
  pnga_set_ghosts(g_a_00,width);
  pnga_set_array_name(g_a_00,array_name);
  pnga_set_irreg_distr(g_a_00,map,nblock);
  pnga_set_pgroup(g_a_00,p_handle);
  lVar1 = pnga_allocate(g_a_00);
  return lVar1;
}

Assistant:

logical pnga_create_ghosts_irreg_config(
        Integer type,     /* MA type */
        Integer ndim,     /* number of dimensions */
        Integer *dims,    /* array of dimensions */
        Integer *width,   /* width of boundary cells for each dimension */
        char *array_name, /* array name */
        Integer *map,     /* decomposition map array */ 
        Integer *nblock,  /* number of blocks for each dimension in map */
        Integer p_handle, /* processor list handle */
        Integer *g_a)     /* array handle (output) */
{
  logical status;
  Integer g_A;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  pnga_pgroup_sync(p_handle);

  g_A = pnga_create_handle();
  *g_a = g_A;
  pnga_set_data(g_A,ndim,dims,type);
  pnga_set_ghosts(g_A,width);
  pnga_set_array_name(g_A,array_name);
  pnga_set_irreg_distr(g_A,map,nblock);
  pnga_set_pgroup(g_A,p_handle);
  status = pnga_allocate(g_A);

  return status;
}